

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

bool Diligent::IsConsistentShaderType(SHADER_TYPE ShaderType,PIPELINE_TYPE PipelineType)

{
  undefined7 in_register_00000031;
  byte bVar1;
  string msg;
  string local_28;
  
  switch(CONCAT71(in_register_00000031,PipelineType) & 0xffffffff) {
  case 0:
    if (ShaderType < (SHADER_TYPE_DOMAIN|SHADER_TYPE_VERTEX)) {
      bVar1 = (byte)(0x10116 >> ((byte)ShaderType & 0x1f));
      goto LAB_00514b26;
    }
    break;
  case 1:
    bVar1 = ShaderType == SHADER_TYPE_COMPUTE;
    goto LAB_00514b26;
  case 2:
    bVar1 = 1;
    if (((ShaderType == SHADER_TYPE_PIXEL) || (ShaderType == SHADER_TYPE_AMPLIFICATION)) ||
       (ShaderType == SHADER_TYPE_MESH)) goto LAB_00514b26;
    break;
  case 3:
    bVar1 = 1;
    if ((int)ShaderType < 0x800) {
      if (((ShaderType == SHADER_TYPE_RAY_GEN) || (ShaderType == SHADER_TYPE_RAY_MISS)) ||
         (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT)) goto LAB_00514b26;
    }
    else if (((ShaderType == SHADER_TYPE_RAY_ANY_HIT) ||
             (ShaderType == SHADER_TYPE_RAY_INTERSECTION)) || (ShaderType == SHADER_TYPE_CALLABLE))
    goto LAB_00514b26;
    break;
  case 4:
    bVar1 = ShaderType == SHADER_TYPE_LAST;
    goto LAB_00514b26;
  default:
    FormatString<char[25]>(&local_28,(char (*) [25])"Unexpected pipeline type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"IsConsistentShaderType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = 0;
LAB_00514b26:
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsConsistentShaderType(SHADER_TYPE ShaderType, PIPELINE_TYPE PipelineType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
            return ShaderType == SHADER_TYPE_VERTEX ||
                ShaderType == SHADER_TYPE_HULL ||
                ShaderType == SHADER_TYPE_DOMAIN ||
                ShaderType == SHADER_TYPE_GEOMETRY ||
                ShaderType == SHADER_TYPE_PIXEL;

        case PIPELINE_TYPE_COMPUTE:
            return ShaderType == SHADER_TYPE_COMPUTE;

        case PIPELINE_TYPE_MESH:
            return ShaderType == SHADER_TYPE_AMPLIFICATION ||
                ShaderType == SHADER_TYPE_MESH ||
                ShaderType == SHADER_TYPE_PIXEL;

        case PIPELINE_TYPE_RAY_TRACING:
            return ShaderType == SHADER_TYPE_RAY_GEN ||
                ShaderType == SHADER_TYPE_RAY_MISS ||
                ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT ||
                ShaderType == SHADER_TYPE_RAY_ANY_HIT ||
                ShaderType == SHADER_TYPE_RAY_INTERSECTION ||
                ShaderType == SHADER_TYPE_CALLABLE;

        case PIPELINE_TYPE_TILE:
            return ShaderType == SHADER_TYPE_TILE;

        default:
            UNEXPECTED("Unexpected pipeline type");
            return false;
    }
}